

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O2

void * th2_func(void *arg)

{
  int __fd;
  ssize_t sVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  timespec tVar7;
  timespec tVar8;
  uint64_t counter2;
  
  __fd = *arg;
  tVar7 = steady_clock_now();
  sVar1 = read(__fd,&counter2,8);
  if (sVar1 == 8) {
    if (counter2 == 1) {
      tVar8 = steady_clock_now();
      lVar4 = tVar8.tv_nsec - tVar7.tv_nsec;
      lVar2 = lVar4 + 1000000000;
      if (-1 < lVar4) {
        lVar2 = lVar4;
      }
      if (499999999 < ((lVar4 >> 0x3f) + (tVar8.tv_sec - tVar7.tv_sec)) * 1000000000 + lVar2) {
        return (void *)0x0;
      }
      pcVar5 = "(int64_t)MS_TO_NSEC(500)";
      pcVar3 = "nano_diff(after, before)";
      uVar6 = 0x96;
    }
    else {
      pcVar5 = "(u64)1";
      pcVar3 = "counter2";
      uVar6 = 0x94;
    }
  }
  else {
    pcVar5 = "(ssize_t)8";
    pcVar3 = "read(fd, &counter2, sizeof(counter2))";
    uVar6 = 0x93;
  }
  fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n",pcVar5,pcVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/owl-compositor[P]epoll-shim/test/tst-timerfd.c"
          ,uVar6);
  abort();
}

Assistant:

static void *
th2_func(void *arg)
{
	int fd = *(int *)arg;
	u64 counter2;
	struct timespec before = steady_clock_now();
	expect(read(fd, &counter2, sizeof(counter2)), (ssize_t)8);
	expect(counter2, (u64)1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(500));
	return NULL;
}